

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O0

void __thiscall CgroupController::enter(CgroupController *this)

{
  int __fd;
  __pid_t __val;
  ContextManager *pCVar1;
  void *__buf;
  size_t __n;
  ssize_t sVar2;
  long lVar3;
  long lVar4;
  string local_90;
  int local_6c;
  undefined1 local_68 [4];
  int cnt;
  string to_write;
  allocator<char> local_31;
  string local_30 [32];
  CgroupController *local_10;
  CgroupController *this_local;
  
  local_10 = this;
  if (this->enter_fd_ == -1) {
    pCVar1 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_30,"Cgroup enter was not delayed",&local_31);
    (**pCVar1->_vptr_ContextManager)(pCVar1,local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  __val = getpid();
  std::__cxx11::to_string((string *)local_68,__val);
  __fd = this->enter_fd_;
  __buf = (void *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::size();
  sVar2 = ::write(__fd,__buf,__n);
  local_6c = (int)sVar2;
  if (-1 < local_6c) {
    lVar3 = (long)local_6c;
    lVar4 = std::__cxx11::string::size();
    if (lVar3 == lVar4) goto LAB_00139aad;
  }
  pCVar1 = ContextManager::get();
  format_abi_cxx11_(&local_90,"Cannot write to cgroups tasks file: %m");
  (**pCVar1->_vptr_ContextManager)(pCVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
LAB_00139aad:
  close_enter_fd(this);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void CgroupController::enter() {
    if (enter_fd_ == -1) {
        die("Cgroup enter was not delayed");
    }
    std::string to_write = std::to_string(getpid());
    int cnt = ::write(enter_fd_, to_write.c_str(), to_write.size());
    if (cnt < 0 || static_cast<size_t>(cnt) != to_write.size()) {
        die(format("Cannot write to cgroups tasks file: %m"));
    }
    close_enter_fd();
}